

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O2

void bcache_init(int nblock,int blocksize,bcache_config *bconfig)

{
  uint uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  char *pcVar4;
  int iVar5;
  timeval begin;
  timeval end;
  
  gettimeofday((timeval *)&begin,(__timezone_ptr_t)0x0);
  freelist = (list)ZEXT816(0);
  file_zombies = (list)ZEXT816(0);
  hash_init(&fnamedic,0x1003,_fname_hash,_fname_cmp);
  bcache_flush_unit = 1;
  bcache_global_config = (bcache_config)bconfig->do_not_cache_doc_blocks;
  bcache_blocksize = blocksize;
  pthread_spin_init(&bcache_lock,1);
  pthread_spin_init(&freelist_lock,1);
  uVar1 = init_rw_lock(&filelist_lock);
  if (uVar1 != 0) {
    fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                 ,"bcache_init",0x5a1,
                 "Error in bcache_init(): RW Lock initialization failed; ErrorCode: %d\n",
                 (ulong)uVar1);
  }
  LOCK();
  freelist_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  num_files = 0;
  file_array_capacity = 0x10000;
  file_list = (fnamedic_item **)calloc(0x10000,8);
  pvVar2 = calloc((long)nblock,(long)bcache_blocksize);
  buffercache_addr = pvVar2;
  iVar5 = 0;
  if (0 < nblock) {
    iVar5 = nblock;
  }
  while (iVar5 != 0) {
    puVar3 = (undefined8 *)malloc(0x40);
    *puVar3 = 0xffffffffffffffff;
    LOCK();
    *(undefined1 *)(puVar3 + 7) = 4;
    UNLOCK();
    *(undefined1 *)((long)puVar3 + 0x39) = 0;
    puVar3[1] = pvVar2;
    pvVar2 = (void *)((long)pvVar2 + (long)bcache_blocksize);
    list_push_front(&freelist,(list_elem *)(puVar3 + 5));
    LOCK();
    freelist_count.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)freelist_count.super___atomic_base<unsigned_long>._M_i + 1);
    UNLOCK();
    iVar5 = iVar5 + -1;
  }
  gettimeofday((timeval *)&end,(__timezone_ptr_t)0x0);
  pcVar4 = "SECOND CHANCE";
  if (bcache_global_config.do_not_cache_doc_blocks != false) {
    pcVar4 = "DO NOT CACHE DOC BLOCKS";
  }
  fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
               ,"bcache_init",0x5c4,
               "Forestdb blockcache size %lu cache %s, num buckets per file %zu, initialized in %ld us\n"
               ,(long)bcache_blocksize * (long)nblock,pcVar4,0x101,
               (end.tv_usec - begin.tv_usec) + (end.tv_sec - begin.tv_sec) * 1000000);
  return;
}

Assistant:

void bcache_init(int nblock, int blocksize, const bcache_config& bconfig)
{
    int i;
    struct bcache_item *item;
    uint8_t *block_ptr;
    struct timeval begin, end;
    gettimeofday(&begin, NULL);

    list_init(&freelist);
    list_init(&file_zombies);

    hash_init(&fnamedic, BCACHE_NDICBUCKET, _fname_hash, _fname_cmp);

    bcache_blocksize = blocksize;
    bcache_flush_unit = BCACHE_FLUSH_UNIT;
    bcache_nblock = nblock;
    bcache_global_config = bconfig;
    spin_init(&bcache_lock);
    spin_init(&freelist_lock);

    int rv = init_rw_lock(&filelist_lock);
    if (rv != 0) {
        fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                "Error in bcache_init(): "
                "RW Lock initialization failed; ErrorCode: %d\n", rv);
    }

    freelist_count = 0;

    num_files = 0;
    file_array_capacity = 65536; // Initial capacity of file list array.
    file_list = (fnamedic_item **) calloc(file_array_capacity, sizeof(fnamedic_item *));
    // Allocate entire buffer cache memory
    block_ptr = (uint8_t *)calloc(nblock, (uint64_t)bcache_blocksize);
    buffercache_addr = block_ptr;

    for (i=0;i<nblock;++i){
        item = (struct bcache_item *)malloc(sizeof(struct bcache_item));

        item->bid = BLK_NOT_FOUND;
        item->flag = 0x0 | BCACHE_FREE;
        item->score = 0;
        item->addr = block_ptr;
        block_ptr += bcache_blocksize;

        list_push_front(&freelist, &item->list_elem);
        freelist_count++;
    }

    gettimeofday(&end, NULL);
    long elapsed = (end.tv_sec - begin.tv_sec) * 1000000 + (end.tv_usec - begin.tv_usec);
    fdb_log(NULL, FDB_LOG_INFO, FDB_RESULT_SUCCESS,
            "Forestdb blockcache size %" _F64
            " cache %s, num buckets per file %zu, initialized in %ld us\n",
            (uint64_t)bcache_blocksize * nblock,
            ( bcache_global_config.do_not_cache_doc_blocks
              ? "DO NOT CACHE DOC BLOCKS"
              : "SECOND CHANCE" ),
            BCACHE_NBUCKET,
            elapsed);
}